

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::h_CBRANCH(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *this_00;
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  byte bVar4;
  size_t sVar5;
  long *plVar6;
  ostream *poVar7;
  
  bVar1 = instr->dst;
  bVar4 = instr->mod >> 4;
  iVar2 = this->registerUsage[bVar1];
  uVar3 = instr->imm32;
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tadd ",5);
  __s = *(char **)(regR + (ulong)bVar1 * 8);
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  plVar6 = (long *)std::ostream::operator<<(this_00,~(0x80 << bVar4) & (0x100 << bVar4 | uVar3));
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\ttest ",6);
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tjz randomx_isn_",0x10);
  plVar6 = (long *)std::ostream::operator<<(this_00,iVar2 + 1);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  this->registerUsage[0] = i;
  this->registerUsage[1] = i;
  this->registerUsage[2] = i;
  this->registerUsage[3] = i;
  this->registerUsage[4] = i;
  this->registerUsage[5] = i;
  this->registerUsage[6] = i;
  this->registerUsage[7] = i;
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		int shift = instr.getModCond() + ConditionOffset;
		int32_t imm = instr.getImm32() | (1L << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1L << (shift - 1));
		asmCode << "\tadd " << regR[reg] << ", " << imm << std::endl;
		asmCode << "\ttest " << regR[reg] << ", " << (ConditionMask << shift) << std::endl;
		asmCode << "\tjz randomx_isn_" << target << std::endl;
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}